

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_description-c.cpp
# Opt level: O2

duckdb_state GetTableDescription(TableDescriptionWrapper *wrapper,idx_t index)

{
  pointer pTVar1;
  unsigned_long in_R8;
  allocator local_59;
  Exception local_58 [2];
  string local_38;
  
  if (wrapper != (TableDescriptionWrapper *)0x0) {
    pTVar1 = duckdb::
             unique_ptr<duckdb::TableDescription,_std::default_delete<duckdb::TableDescription>,_true>
             ::operator->(&wrapper->description);
    if (index < (ulong)(((long)(pTVar1->columns).
                               super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                               .
                               super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(pTVar1->columns).
                              super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                              .
                              super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                              ._M_impl.super__Vector_impl_data._M_start) / 0xd8)) {
      return DuckDBSuccess;
    }
    std::__cxx11::string::string
              ((string *)local_58,"Column index %d is out of range, table only has %d columns",
               &local_59);
    pTVar1 = duckdb::
             unique_ptr<duckdb::TableDescription,_std::default_delete<duckdb::TableDescription>,_true>
             ::operator->(&wrapper->description);
    duckdb::Exception::ConstructMessage<unsigned_long,unsigned_long>
              (&local_38,local_58,(string *)index,
               ((long)(pTVar1->columns).
                      super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                      .
                      super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
               (long)(pTVar1->columns).
                     super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                     .
                     super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                     ._M_impl.super__Vector_impl_data._M_start) / 0xd8,in_R8);
    std::__cxx11::string::operator=((string *)&wrapper->error,(string *)&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::__cxx11::string::~string((string *)local_58);
  }
  return DuckDBError;
}

Assistant:

duckdb_state GetTableDescription(TableDescriptionWrapper *wrapper, idx_t index) {
	if (!wrapper) {
		return DuckDBError;
	}
	auto &table = wrapper->description;
	if (index >= table->columns.size()) {
		wrapper->error = duckdb::StringUtil::Format("Column index %d is out of range, table only has %d columns", index,
		                                            table->columns.size());
		return DuckDBError;
	}
	return DuckDBSuccess;
}